

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spirv_cross::CombinedImageSampler,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::operator=
          (SmallVector<spirv_cross::CombinedImageSampler,_8UL> *this,
          SmallVector<spirv_cross::CombinedImageSampler,_8UL> *other)

{
  ulong uVar1;
  CombinedImageSampler *pCVar2;
  CombinedImageSampler *pCVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  if (this != other) {
    (this->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size = 0;
    reserve(this,(other->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size);
    lVar4 = 0;
    for (uVar5 = 0; uVar1 = (other->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size
        , uVar5 < uVar1; uVar5 = uVar5 + 1) {
      pCVar2 = (this->super_VectorView<spirv_cross::CombinedImageSampler>).ptr;
      pCVar3 = (other->super_VectorView<spirv_cross::CombinedImageSampler>).ptr;
      *(undefined4 *)((long)&(pCVar2->sampler_id).id + lVar4) =
           *(undefined4 *)((long)&(pCVar3->sampler_id).id + lVar4);
      *(undefined8 *)((long)&(pCVar2->combined_id).id + lVar4) =
           *(undefined8 *)((long)&(pCVar3->combined_id).id + lVar4);
      lVar4 = lVar4 + 0xc;
    }
    (this->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size = uVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}